

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O3

int mriStep_StageERKFast(ARKodeMem ark_mem,ARKodeMRIStepMem step_mem,int is)

{
  realtype *prVar1;
  MRIStepInnerEvolveFn p_Var2;
  int iVar3;
  int iVar4;
  MRIStepInnerStepper p_Var5;
  double dVar6;
  double dVar7;
  
  prVar1 = step_mem->MRIC->c;
  dVar6 = prVar1[(long)is + -1];
  dVar7 = ark_mem->h * dVar6 + ark_mem->tn;
  dVar6 = prVar1[is] - dVar6;
  iVar3 = mriStep_ComputeInnerForcing(step_mem,is,dVar6);
  if (iVar3 != 0) {
    return iVar3;
  }
  p_Var5 = step_mem->stepper;
  p_Var5->tshift = dVar7;
  p_Var5->tscale = dVar6 * ark_mem->h;
  if (step_mem->pre_inner_evolve != (MRIStepPreInnerFn)0x0) {
    iVar3 = (*step_mem->pre_inner_evolve)(dVar7,p_Var5->forcing,p_Var5->nforcing,ark_mem->user_data)
    ;
    if (iVar3 != 0) {
      return -0x23;
    }
    p_Var5 = step_mem->stepper;
    if (p_Var5 == (MRIStepInnerStepper)0x0) {
      return -0x22;
    }
  }
  iVar3 = -0x22;
  if ((p_Var5->ops != (MRIStepInnerStepper_Ops)0x0) &&
     (p_Var2 = p_Var5->ops->evolve, p_Var2 != (MRIStepInnerEvolveFn)0x0)) {
    iVar4 = (*p_Var2)(p_Var5,dVar7,ark_mem->tcur,ark_mem->ycur);
    p_Var5->last_flag = iVar4;
    if (-1 < iVar4) {
      if ((step_mem->post_inner_evolve != (MRIStepPostInnerFn)0x0) &&
         (iVar3 = (*step_mem->post_inner_evolve)(ark_mem->tcur,ark_mem->ycur,ark_mem->user_data),
         iVar3 != 0)) {
        return -0x24;
      }
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int mriStep_StageERKFast(ARKodeMem ark_mem,
                         ARKodeMRIStepMem step_mem, int is)
{
  realtype cdiff;    /* stage time increment */
  realtype t0;       /* start time for stage */
  int retval;        /* reusable return flag */

#ifdef SUNDIALS_DEBUG
  printf("    MRIStep ERK fast stage\n");
#endif

  /* Set initial time for fast evolution */
  t0 = ark_mem->tn + step_mem->MRIC->c[is-1]*ark_mem->h;

  /* compute the inner forcing */
  cdiff = step_mem->MRIC->c[is] - step_mem->MRIC->c[is-1];
  retval = mriStep_ComputeInnerForcing(step_mem, is, cdiff);
  if (retval != ARK_SUCCESS) return(retval);

  /* Set inner forcing time normalization constants */
  step_mem->stepper->tshift = t0;
  step_mem->stepper->tscale = cdiff * ark_mem->h;

  /* pre inner evolve function (if supplied) */
  if (step_mem->pre_inner_evolve) {
    retval = step_mem->pre_inner_evolve(t0, step_mem->stepper->forcing,
                                        step_mem->stepper->nforcing,
                                        ark_mem->user_data);
    if (retval != 0) return(ARK_OUTERTOINNER_FAIL);
  }

  /* advance inner method in time */
  retval = mriStepInnerStepper_Evolve(step_mem->stepper, t0, ark_mem->tcur,
                                      ark_mem->ycur);
  if (retval < 0) return(ARK_INNERSTEP_FAIL);

  /* post inner evolve function (if supplied) */
  if (step_mem->post_inner_evolve) {
    retval = step_mem->post_inner_evolve(ark_mem->tcur, ark_mem->ycur,
                                         ark_mem->user_data);
    if (retval != 0) return(ARK_INNERTOOUTER_FAIL);
  }

  /* return with success */
  return(ARK_SUCCESS);
}